

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_flac_read_pcm_frames_f32(ma_dr_flac *pFlac,ma_uint64 framesToRead,float *pBufferOut)

{
  ma_uint32 *pmVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  ma_uint8 mVar7;
  ma_int32 *pmVar8;
  ma_int32 *pmVar9;
  uint uVar10;
  char cVar11;
  int iVar12;
  ma_bool32 mVar13;
  int iVar14;
  byte bVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  float *pfVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  ma_uint64 mVar36;
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  
  if (framesToRead == 0 || pFlac == (ma_dr_flac *)0x0) {
    mVar36 = 0;
  }
  else {
    if (pBufferOut == (float *)0x0) {
      mVar36 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,framesToRead);
      return mVar36;
    }
    bVar6 = pFlac->bitsPerSample;
    iVar34 = 0x20 - (uint)bVar6;
    iVar12 = 0x1f - (uint)bVar6;
    uVar18 = (uint)bVar6;
    iVar17 = 0x17 - uVar18;
    mVar36 = 0;
    do {
      uVar21 = (pFlac->currentFLACFrame).pcmFramesRemaining;
      uVar22 = (ulong)uVar21;
      if (uVar22 == 0) {
        mVar13 = ma_dr_flac__read_and_decode_next_flac_frame(pFlac);
        if (mVar13 == 0) {
          return mVar36;
        }
      }
      else {
        mVar7 = (pFlac->currentFLACFrame).header.channelAssignment;
        bVar6 = (&DAT_0019be50)[(char)mVar7];
        uVar31 = (ulong)((pFlac->currentFLACFrame).header.blockSizeInPCMFrames - uVar21);
        if (framesToRead < uVar22) {
          uVar22 = framesToRead;
        }
        uVar21 = (uint)uVar22;
        cVar11 = (char)iVar34;
        if ((0x702UL >> ((long)(char)mVar7 & 0x3fU) & 1) == 0) {
          uVar29 = 1;
          if (1 < bVar6) {
            uVar29 = (uint)bVar6;
          }
          uVar28 = 0;
          pfVar24 = pBufferOut;
          do {
            uVar32 = 0;
            do {
              *(float *)((long)pfVar24 + uVar32) =
                   (float)(*(int *)(*(long *)((long)&(pFlac->currentFLACFrame).subframes[0].
                                                     pSamplesS32 + uVar32 * 4) + uVar28 * 4 +
                                   uVar31 * 4) <<
                          ((&(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample)[uVar32 * 4]
                           + cVar11 & 0x1f)) * 4.656613e-10;
              uVar32 = uVar32 + 4;
            } while (uVar29 << 2 != uVar32);
            uVar28 = uVar28 + 1;
            pfVar24 = (float *)((long)pfVar24 + (ulong)((uint)bVar6 * 4));
          } while (uVar28 != uVar22);
        }
        else {
          pmVar8 = (pFlac->currentFLACFrame).subframes[0].pSamplesS32;
          pmVar9 = (pFlac->currentFLACFrame).subframes[1].pSamplesS32;
          if (mVar7 == '\n') {
            if (((ma_dr_flac__gIsSSE2Supported & 1) == 0) || (0x18 < pFlac->bitsPerSample)) {
              if (uVar18 == 0x20) {
                if (3 < uVar22) {
                  uVar23 = (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  uVar29 = (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                  lVar25 = 0;
                  do {
                    uVar4 = *(undefined8 *)((long)pmVar8 + lVar25 + uVar31 * 4);
                    uVar5 = *(undefined8 *)((long)pmVar9 + lVar25 + uVar31 * 4);
                    uVar10 = (uint)((ulong)uVar5 >> 0x20);
                    uVar45 = (int)uVar5 << uVar23;
                    uVar46 = uVar45 & 1 | ((int)uVar4 << uVar29) * 2;
                    uVar47 = uVar10 & 1 | (int)((ulong)uVar4 >> 0x20) << 1;
                    pfVar24 = (float *)((long)pBufferOut + lVar25 * 2);
                    *pfVar24 = (float)((int)(uVar46 + uVar45) >> 1) * 4.656613e-10;
                    pfVar24[1] = (float)((int)(uVar46 - uVar45) >> 1) * 4.656613e-10;
                    pfVar24[2] = (float)((int)(uVar47 + uVar10) >> 1) * 4.656613e-10;
                    pfVar24[3] = (float)((int)(uVar47 - uVar10) >> 1) * 4.656613e-10;
                    uVar4 = *(undefined8 *)((long)pmVar8 + lVar25 + uVar31 * 4 + 8);
                    uVar5 = *(undefined8 *)((long)pmVar9 + lVar25 + uVar31 * 4 + 8);
                    uVar10 = (uint)((ulong)uVar5 >> 0x20);
                    uVar45 = (int)uVar5 << uVar23;
                    uVar46 = uVar45 & 1 | ((int)uVar4 << uVar29) * 2;
                    uVar47 = uVar10 & 1 | (int)((ulong)uVar4 >> 0x20) * 2;
                    pfVar24 = (float *)((long)pBufferOut + lVar25 * 2 + 0x10);
                    *pfVar24 = (float)((int)(uVar46 + uVar45) >> 1) * 4.656613e-10;
                    pfVar24[1] = (float)((int)(uVar46 - uVar45) >> 1) * 4.656613e-10;
                    pfVar24[2] = (float)((int)(uVar47 + uVar10) >> 1) * 4.656613e-10;
                    pfVar24[3] = (float)((int)(uVar47 - uVar10) >> 1) * 4.656613e-10;
                    lVar25 = lVar25 + 0x10;
                  } while ((uVar22 >> 2) * 0x10 != lVar25);
                }
              }
              else if (3 < uVar22) {
                uVar23 = (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                uVar29 = (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                lVar25 = 0;
                do {
                  uVar4 = *(undefined8 *)((long)pmVar8 + lVar25 + uVar31 * 4);
                  uVar5 = *(undefined8 *)((long)pmVar9 + lVar25 + uVar31 * 4);
                  uVar10 = (uint)((ulong)uVar5 >> 0x20);
                  uVar45 = (int)uVar5 << uVar23;
                  uVar46 = uVar45 & 1 | ((int)uVar4 << uVar29) * 2;
                  uVar47 = uVar10 & 1 | (int)((ulong)uVar4 >> 0x20) << 1;
                  pfVar24 = (float *)((long)pBufferOut + lVar25 * 2);
                  *pfVar24 = (float)(int)(uVar46 + uVar45 << iVar12) * 4.656613e-10;
                  pfVar24[1] = (float)(int)(uVar46 - uVar45) * 4.656613e-10;
                  pfVar24[2] = (float)(int)(uVar47 + uVar10) * 4.656613e-10;
                  pfVar24[3] = (float)(int)(uVar47 - uVar10) * 4.656613e-10;
                  uVar4 = *(undefined8 *)((long)pmVar8 + lVar25 + uVar31 * 4 + 8);
                  uVar5 = *(undefined8 *)((long)pmVar9 + lVar25 + uVar31 * 4 + 8);
                  uVar10 = (uint)((ulong)uVar5 >> 0x20);
                  uVar45 = (int)uVar5 << uVar23;
                  uVar46 = uVar45 & 1 | ((int)uVar4 << uVar29) * 2;
                  uVar47 = uVar10 & 1 | (int)((ulong)uVar4 >> 0x20) * 2;
                  pfVar24 = (float *)((long)pBufferOut + lVar25 * 2 + 0x10);
                  *pfVar24 = (float)(int)(uVar46 + uVar45 << iVar12) * 4.656613e-10;
                  pfVar24[1] = (float)(int)(uVar46 - uVar45) * 4.656613e-10;
                  pfVar24[2] = (float)(int)(uVar47 + uVar10) * 4.656613e-10;
                  pfVar24[3] = (float)(int)(uVar47 - uVar10) * 4.656613e-10;
                  lVar25 = lVar25 + 0x10;
                } while ((uVar22 >> 2) * 0x10 != lVar25);
              }
              uVar28 = (ulong)(uVar21 & 0xfffffffc);
              if (uVar28 != uVar22) {
                bVar15 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                bVar16 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                do {
                  uVar29 = pmVar9[uVar31 + uVar28] << (bVar16 & 0x1f);
                  iVar14 = (uVar29 & 1) + (pmVar8[uVar31 + uVar28] << (bVar15 & 0x1f)) * 2;
                  *(ulong *)(pBufferOut + uVar28 * 2) =
                       CONCAT44((float)((int)(iVar14 - uVar29) >> 1) * 4.656613e-10,
                                (float)(((int)(iVar14 + uVar29) >> 1) << iVar34) * 4.656613e-10);
                  uVar28 = uVar28 + 1;
                } while (uVar28 < uVar22);
              }
            }
            else if (uVar18 == 0x18) {
              if (3 < uVar22) {
                lVar25 = 0;
                do {
                  piVar2 = (int *)((long)pmVar8 + lVar25 + uVar31 * 4);
                  piVar3 = (int *)((long)pmVar9 + lVar25 + uVar31 * 4);
                  uVar29 = piVar3[1];
                  uVar23 = piVar3[2];
                  uVar10 = piVar3[3];
                  uVar45 = *piVar3 <<
                           (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  uVar46 = uVar45 & 1 |
                           (*piVar2 <<
                           (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample) * 2;
                  uVar47 = uVar29 & 1 | piVar2[1] * 2;
                  uVar48 = uVar23 & 1 | piVar2[2] * 2;
                  uVar49 = uVar10 & 1 | piVar2[3] * 2;
                  pfVar24 = (float *)((long)pBufferOut + lVar25 * 2);
                  *pfVar24 = (float)((int)(uVar46 + uVar45) >> 1) * 1.1920929e-07;
                  pfVar24[1] = (float)((int)(uVar46 - uVar45) >> 1) * 1.1920929e-07;
                  pfVar24[2] = (float)((int)(uVar47 + uVar29) >> 1) * 1.1920929e-07;
                  pfVar24[3] = (float)((int)(uVar47 - uVar29) >> 1) * 1.1920929e-07;
                  auVar39._4_4_ = (float)((int)(uVar48 - uVar23) >> 1) * 1.1920929e-07;
                  auVar39._0_4_ = (float)((int)(uVar48 + uVar23) >> 1) * 1.1920929e-07;
                  auVar39._8_4_ = (float)((int)(uVar49 + uVar10) >> 1) * 1.1920929e-07;
                  auVar39._12_4_ = (float)((int)(uVar49 - uVar10) >> 1) * 1.1920929e-07;
                  *(undefined1 (*) [16])((long)pBufferOut + lVar25 * 2 + 0x10) = auVar39;
                  lVar25 = lVar25 + 0x10;
                } while ((uVar22 >> 2) * 0x10 != lVar25);
              }
              uVar28 = (ulong)(uVar21 & 0xfffffffc);
              if (uVar28 != uVar22) {
                bVar15 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                bVar16 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                do {
                  uVar29 = pmVar9[uVar31 + uVar28] << (bVar16 & 0x1f);
                  iVar14 = (uVar29 & 1) + (pmVar8[uVar31 + uVar28] << (bVar15 & 0x1f)) * 2;
                  *(ulong *)(pBufferOut + uVar28 * 2) =
                       CONCAT44((float)((int)(iVar14 - uVar29) >> 1) * 1.1920929e-07,
                                (float)((int)(iVar14 + uVar29) >> 1) * 1.1920929e-07);
                  uVar28 = uVar28 + 1;
                } while (uVar28 < uVar22);
              }
            }
            else {
              if (3 < uVar22) {
                lVar25 = 0;
                do {
                  piVar2 = (int *)((long)pmVar8 + lVar25 + uVar31 * 4);
                  piVar3 = (int *)((long)pmVar9 + lVar25 + uVar31 * 4);
                  uVar29 = piVar3[1];
                  uVar23 = piVar3[2];
                  uVar10 = piVar3[3];
                  uVar45 = *piVar3 <<
                           (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  uVar46 = uVar45 & 1 |
                           (*piVar2 <<
                           (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample) * 2;
                  uVar47 = uVar29 & 1 | piVar2[1] * 2;
                  uVar48 = uVar23 & 1 | piVar2[2] * 2;
                  uVar49 = uVar10 & 1 | piVar2[3] * 2;
                  pfVar24 = (float *)((long)pBufferOut + lVar25 * 2);
                  *pfVar24 = (float)(int)(uVar46 + uVar45 << iVar17) * 1.1920929e-07;
                  pfVar24[1] = (float)(int)(uVar46 - uVar45 << iVar17) * 1.1920929e-07;
                  pfVar24[2] = (float)(int)(uVar47 + uVar29) * 1.1920929e-07;
                  pfVar24[3] = (float)(int)(uVar47 - uVar29) * 1.1920929e-07;
                  auVar43._4_4_ = (float)(int)(uVar48 - uVar23) * 1.1920929e-07;
                  auVar43._0_4_ = (float)(int)(uVar48 + uVar23) * 1.1920929e-07;
                  auVar43._8_4_ = (float)(int)(uVar49 + uVar10) * 1.1920929e-07;
                  auVar43._12_4_ = (float)(int)(uVar49 - uVar10) * 1.1920929e-07;
                  *(undefined1 (*) [16])((long)pBufferOut + lVar25 * 2 + 0x10) = auVar43;
                  lVar25 = lVar25 + 0x10;
                } while ((uVar22 >> 2) * 0x10 != lVar25);
              }
              uVar28 = (ulong)(uVar21 & 0xfffffffc);
              if (uVar28 != uVar22) {
                bVar15 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                bVar16 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                do {
                  uVar29 = pmVar9[uVar31 + uVar28] << (bVar16 & 0x1f);
                  iVar14 = (uVar29 & 1) + (pmVar8[uVar31 + uVar28] << (bVar15 & 0x1f)) * 2;
                  *(ulong *)(pBufferOut + uVar28 * 2) =
                       CONCAT44((float)(int)(iVar14 - uVar29) * 1.1920929e-07,
                                (float)(int)(iVar14 + uVar29 << iVar17) * 1.1920929e-07);
                  uVar28 = uVar28 + 1;
                } while (uVar28 < uVar22);
              }
            }
          }
          else if (mVar7 == '\t') {
            if ((ma_dr_flac__gIsSSE2Supported & 1) == 0) {
              bVar15 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar16 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
            }
            else {
              bVar15 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar16 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
              if (pFlac->bitsPerSample < 0x19) {
                iVar14 = (bVar15 - uVar18) + 0x18;
                iVar19 = (bVar16 - uVar18) + 0x18;
                if (3 < uVar22) {
                  lVar25 = 0;
                  do {
                    piVar2 = (int *)((long)pmVar8 + lVar25 + uVar31 * 4);
                    iVar26 = piVar2[1];
                    iVar27 = piVar2[2];
                    iVar20 = piVar2[3];
                    piVar3 = (int *)((long)pmVar9 + lVar25 + uVar31 * 4);
                    iVar30 = piVar3[1];
                    iVar33 = piVar3[2];
                    iVar35 = piVar3[3];
                    iVar44 = *piVar3 << iVar19;
                    pfVar24 = (float *)((long)pBufferOut + lVar25 * 2);
                    *pfVar24 = (float)((*piVar2 << iVar14) + iVar44) * 1.1920929e-07;
                    pfVar24[1] = (float)iVar44 * 1.1920929e-07;
                    pfVar24[2] = (float)(iVar26 + iVar30) * 1.1920929e-07;
                    pfVar24[3] = (float)iVar30 * 1.1920929e-07;
                    auVar38._4_4_ = (float)iVar33 * 1.1920929e-07;
                    auVar38._0_4_ = (float)(iVar27 + iVar33) * 1.1920929e-07;
                    auVar38._8_4_ = (float)(iVar20 + iVar35) * 1.1920929e-07;
                    auVar38._12_4_ = (float)iVar35 * 1.1920929e-07;
                    *(undefined1 (*) [16])((long)pBufferOut + lVar25 * 2 + 0x10) = auVar38;
                    lVar25 = lVar25 + 0x10;
                  } while ((uVar22 >> 2) * 0x10 != lVar25);
                }
                uVar28 = (ulong)(uVar21 & 0xfffffffc);
                if (uVar28 != uVar22) {
                  do {
                    iVar26 = pmVar9[uVar31 + uVar28] << ((byte)iVar19 & 0x1f);
                    *(ulong *)(pBufferOut + uVar28 * 2) =
                         CONCAT44((float)iVar26 * 1.1920929e-07,
                                  (float)((pmVar8[uVar31 + uVar28] << ((byte)iVar14 & 0x1f)) +
                                         iVar26) * 1.1920929e-07);
                    uVar28 = uVar28 + 1;
                  } while (uVar28 < uVar22);
                }
                goto LAB_0016a114;
              }
            }
            bVar15 = bVar15 + cVar11;
            bVar16 = bVar16 + cVar11;
            if (3 < uVar22) {
              lVar25 = 0;
              do {
                iVar14 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4 + 4);
                iVar19 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4 + 8);
                iVar26 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4 + 0xc);
                iVar33 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4) << (bVar16 & 0x1f);
                iVar30 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4 + 4) << (bVar16 & 0x1f);
                iVar27 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4 + 8) << (bVar16 & 0x1f);
                iVar20 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4 + 0xc) << (bVar16 & 0x1f);
                pfVar24 = (float *)((long)pBufferOut + lVar25 * 2);
                *pfVar24 = (float)((*(int *)((long)pmVar8 + lVar25 + uVar31 * 4) << (bVar15 & 0x1f))
                                  + iVar33) * 4.656613e-10;
                pfVar24[1] = (float)iVar33 * 4.656613e-10;
                pfVar24[2] = (float)((iVar14 << (bVar15 & 0x1f)) + iVar30) * 4.656613e-10;
                pfVar24[3] = (float)iVar30 * 4.656613e-10;
                auVar41._0_4_ = (float)((iVar19 << (bVar15 & 0x1f)) + iVar27) * 4.656613e-10;
                auVar41._4_4_ = (float)iVar27 * 4.656613e-10;
                auVar41._8_4_ = (float)((iVar26 << (bVar15 & 0x1f)) + iVar20) * 4.656613e-10;
                auVar41._12_4_ = (float)iVar20 * 4.656613e-10;
                *(undefined1 (*) [16])((long)pBufferOut + lVar25 * 2 + 0x10) = auVar41;
                lVar25 = lVar25 + 0x10;
              } while ((uVar22 >> 2) << 4 != lVar25);
            }
            uVar28 = (ulong)(uVar21 & 0xfffffffc);
            if (uVar28 != uVar22) {
              do {
                iVar14 = pmVar9[uVar31 + uVar28] << (bVar16 & 0x1f);
                *(ulong *)(pBufferOut + uVar28 * 2) =
                     CONCAT44((float)iVar14 * 4.656613e-10,
                              (float)((pmVar8[uVar31 + uVar28] << (bVar15 & 0x1f)) + iVar14) *
                              4.656613e-10);
                uVar28 = uVar28 + 1;
              } while (uVar28 < uVar22);
            }
          }
          else if (mVar7 == '\b') {
            if ((ma_dr_flac__gIsSSE2Supported & 1) == 0) {
              bVar15 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar16 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
            }
            else {
              bVar15 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar16 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
              if (pFlac->bitsPerSample < 0x19) {
                iVar14 = (bVar15 - uVar18) + 0x18;
                iVar19 = (bVar16 - uVar18) + 0x18;
                if (3 < uVar22) {
                  lVar25 = 0;
                  do {
                    piVar2 = (int *)((long)pmVar8 + lVar25 + uVar31 * 4);
                    iVar26 = piVar2[1];
                    iVar27 = piVar2[2];
                    iVar20 = piVar2[3];
                    iVar37 = *piVar2 << iVar14;
                    piVar2 = (int *)((long)pmVar9 + lVar25 + uVar31 * 4);
                    iVar30 = *piVar2;
                    iVar33 = piVar2[1];
                    iVar35 = piVar2[2];
                    iVar44 = piVar2[3];
                    pfVar24 = (float *)((long)pBufferOut + lVar25 * 2);
                    *pfVar24 = (float)iVar37 * 1.1920929e-07;
                    pfVar24[1] = (float)(iVar37 - (iVar30 << iVar19)) * 1.1920929e-07;
                    pfVar24[2] = (float)iVar26 * 1.1920929e-07;
                    pfVar24[3] = (float)(iVar26 - iVar33) * 1.1920929e-07;
                    pfVar24 = (float *)((long)pBufferOut + lVar25 * 2 + 0x10);
                    *pfVar24 = (float)iVar27 * 1.1920929e-07;
                    pfVar24[1] = (float)(iVar27 - iVar35) * 1.1920929e-07;
                    pfVar24[2] = (float)iVar20 * 1.1920929e-07;
                    pfVar24[3] = (float)(iVar20 - iVar44) * 1.1920929e-07;
                    lVar25 = lVar25 + 0x10;
                  } while ((uVar22 >> 2) * 0x10 != lVar25);
                }
                uVar28 = (ulong)(uVar21 & 0xfffffffc);
                if (uVar28 != uVar22) {
                  do {
                    iVar26 = pmVar8[uVar31 + uVar28] << ((byte)iVar14 & 0x1f);
                    *(ulong *)(pBufferOut + uVar28 * 2) =
                         CONCAT44((float)(iVar26 - (pmVar9[uVar31 + uVar28] << ((byte)iVar19 & 0x1f)
                                                   )) * 1.1920929e-07,(float)iVar26 * 1.1920929e-07)
                    ;
                    uVar28 = uVar28 + 1;
                  } while (uVar28 < uVar22);
                }
                goto LAB_0016a114;
              }
            }
            bVar15 = bVar15 + cVar11;
            bVar16 = bVar16 + cVar11;
            if (3 < uVar22) {
              lVar25 = 0;
              do {
                iVar14 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4);
                iVar19 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4 + 4);
                iVar26 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4 + 8);
                iVar27 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4 + 0xc);
                iVar33 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4) << (bVar15 & 0x1f);
                iVar35 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4 + 4) << (bVar15 & 0x1f);
                iVar30 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4 + 8) << (bVar15 & 0x1f);
                iVar20 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4 + 0xc) << (bVar15 & 0x1f);
                pfVar24 = (float *)((long)pBufferOut + lVar25 * 2);
                *pfVar24 = (float)iVar33 * 4.656613e-10;
                pfVar24[1] = (float)(iVar33 - (iVar14 << (bVar16 & 0x1f))) * 4.656613e-10;
                pfVar24[2] = (float)iVar35 * 4.656613e-10;
                pfVar24[3] = (float)(iVar35 - (iVar19 << (bVar16 & 0x1f))) * 4.656613e-10;
                auVar42._0_4_ = (float)iVar30 * 4.656613e-10;
                auVar42._4_4_ = (float)(iVar30 - (iVar26 << (bVar16 & 0x1f))) * 4.656613e-10;
                auVar42._8_4_ = (float)iVar20 * 4.656613e-10;
                auVar42._12_4_ = (float)(iVar20 - (iVar27 << (bVar16 & 0x1f))) * 4.656613e-10;
                *(undefined1 (*) [16])((long)pBufferOut + lVar25 * 2 + 0x10) = auVar42;
                lVar25 = lVar25 + 0x10;
              } while ((uVar22 >> 2) << 4 != lVar25);
            }
            uVar28 = (ulong)(uVar21 & 0xfffffffc);
            if (uVar28 != uVar22) {
              do {
                iVar14 = pmVar8[uVar31 + uVar28] << (bVar15 & 0x1f);
                *(ulong *)(pBufferOut + uVar28 * 2) =
                     CONCAT44((float)(iVar14 - (pmVar9[uVar31 + uVar28] << (bVar16 & 0x1f))) *
                              4.656613e-10,(float)iVar14 * 4.656613e-10);
                uVar28 = uVar28 + 1;
              } while (uVar28 < uVar22);
            }
          }
          else {
            if ((ma_dr_flac__gIsSSE2Supported & 1) == 0) {
              bVar15 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar16 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
            }
            else {
              bVar15 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
              bVar16 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
              if (pFlac->bitsPerSample < 0x19) {
                iVar14 = (bVar15 - uVar18) + 0x18;
                iVar19 = (bVar16 - uVar18) + 0x18;
                if (3 < uVar22) {
                  lVar25 = 0;
                  do {
                    piVar2 = (int *)((long)pmVar8 + lVar25 + uVar31 * 4);
                    iVar26 = piVar2[1];
                    iVar27 = piVar2[2];
                    iVar20 = piVar2[3];
                    piVar3 = (int *)((long)pmVar9 + lVar25 + uVar31 * 4);
                    iVar30 = *piVar3;
                    iVar33 = piVar3[1];
                    iVar35 = piVar3[2];
                    iVar44 = piVar3[3];
                    pfVar24 = (float *)((long)pBufferOut + lVar25 * 2);
                    *pfVar24 = (float)(*piVar2 << iVar14) * 1.1920929e-07;
                    pfVar24[1] = (float)(iVar30 << iVar19) * 1.1920929e-07;
                    pfVar24[2] = (float)iVar26 * 1.1920929e-07;
                    pfVar24[3] = (float)iVar33 * 1.1920929e-07;
                    auVar40._4_4_ = (float)iVar35 * 1.1920929e-07;
                    auVar40._0_4_ = (float)iVar27 * 1.1920929e-07;
                    auVar40._8_4_ = (float)iVar20 * 1.1920929e-07;
                    auVar40._12_4_ = (float)iVar44 * 1.1920929e-07;
                    *(undefined1 (*) [16])((long)pBufferOut + lVar25 * 2 + 0x10) = auVar40;
                    lVar25 = lVar25 + 0x10;
                  } while ((uVar22 >> 2) * 0x10 != lVar25);
                }
                uVar28 = (ulong)(uVar21 & 0xfffffffc);
                if (uVar28 != uVar22) {
                  do {
                    pBufferOut[uVar28 * 2] =
                         (float)(pmVar8[uVar31 + uVar28] << ((byte)iVar14 & 0x1f)) * 1.1920929e-07;
                    pBufferOut[uVar28 * 2 + 1] =
                         (float)(pmVar9[uVar31 + uVar28] << ((byte)iVar19 & 0x1f)) * 1.1920929e-07;
                    uVar28 = uVar28 + 1;
                  } while (uVar28 < uVar22);
                }
                goto LAB_0016a114;
              }
            }
            bVar15 = bVar15 + cVar11;
            bVar16 = bVar16 + cVar11;
            if (3 < uVar22) {
              lVar25 = 0;
              do {
                iVar14 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4 + 4);
                iVar19 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4 + 8);
                iVar26 = *(int *)((long)pmVar8 + lVar25 + uVar31 * 4 + 0xc);
                iVar27 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4);
                iVar20 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4 + 4);
                iVar30 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4 + 8);
                iVar33 = *(int *)((long)pmVar9 + lVar25 + uVar31 * 4 + 0xc);
                *(float *)((long)pBufferOut + lVar25 * 2) =
                     (float)(*(int *)((long)pmVar8 + lVar25 + uVar31 * 4) << (bVar15 & 0x1f)) *
                     4.656613e-10;
                *(float *)((long)pBufferOut + lVar25 * 2 + 4) =
                     (float)(iVar27 << (bVar16 & 0x1f)) * 4.656613e-10;
                *(float *)((long)pBufferOut + lVar25 * 2 + 8) =
                     (float)(iVar14 << (bVar15 & 0x1f)) * 4.656613e-10;
                *(float *)((long)pBufferOut + lVar25 * 2 + 0xc) =
                     (float)(iVar20 << (bVar16 & 0x1f)) * 4.656613e-10;
                *(float *)((long)pBufferOut + lVar25 * 2 + 0x10) =
                     (float)(iVar19 << (bVar15 & 0x1f)) * 4.656613e-10;
                *(float *)((long)pBufferOut + lVar25 * 2 + 0x14) =
                     (float)(iVar30 << (bVar16 & 0x1f)) * 4.656613e-10;
                *(float *)((long)pBufferOut + lVar25 * 2 + 0x18) =
                     (float)(iVar26 << (bVar15 & 0x1f)) * 4.656613e-10;
                *(float *)((long)pBufferOut + lVar25 * 2 + 0x1c) =
                     (float)(iVar33 << (bVar16 & 0x1f)) * 4.656613e-10;
                lVar25 = lVar25 + 0x10;
              } while ((uVar22 >> 2) * 0x10 != lVar25);
            }
            uVar28 = (ulong)(uVar21 & 0xfffffffc);
            if (uVar28 != uVar22) {
              do {
                pBufferOut[uVar28 * 2] =
                     (float)(pmVar8[uVar31 + uVar28] << (bVar15 & 0x1f)) * 4.656613e-10;
                pBufferOut[uVar28 * 2 + 1] =
                     (float)(pmVar9[uVar31 + uVar28] << (bVar16 & 0x1f)) * 4.656613e-10;
                uVar28 = uVar28 + 1;
              } while (uVar28 < uVar22);
            }
          }
        }
LAB_0016a114:
        mVar36 = mVar36 + uVar22;
        pBufferOut = pBufferOut + bVar6 * uVar22;
        pFlac->currentPCMFrame = pFlac->currentPCMFrame + uVar22;
        framesToRead = framesToRead - uVar22;
        pmVar1 = &(pFlac->currentFLACFrame).pcmFramesRemaining;
        *pmVar1 = *pmVar1 - uVar21;
      }
    } while (framesToRead != 0);
  }
  return mVar36;
}

Assistant:

MA_API ma_uint64 ma_dr_flac_read_pcm_frames_f32(ma_dr_flac* pFlac, ma_uint64 framesToRead, float* pBufferOut)
{
    ma_uint64 framesRead;
    ma_uint32 unusedBitsPerSample;
    if (pFlac == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, framesToRead);
    }
    MA_DR_FLAC_ASSERT(pFlac->bitsPerSample <= 32);
    unusedBitsPerSample = 32 - pFlac->bitsPerSample;
    framesRead = 0;
    while (framesToRead > 0) {
        if (pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                break;
            }
        } else {
            unsigned int channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
            ma_uint64 iFirstPCMFrame = pFlac->currentFLACFrame.header.blockSizeInPCMFrames - pFlac->currentFLACFrame.pcmFramesRemaining;
            ma_uint64 frameCountThisIteration = framesToRead;
            if (frameCountThisIteration > pFlac->currentFLACFrame.pcmFramesRemaining) {
                frameCountThisIteration = pFlac->currentFLACFrame.pcmFramesRemaining;
            }
            if (channelCount == 2) {
                const ma_int32* pDecodedSamples0 = pFlac->currentFLACFrame.subframes[0].pSamplesS32 + iFirstPCMFrame;
                const ma_int32* pDecodedSamples1 = pFlac->currentFLACFrame.subframes[1].pSamplesS32 + iFirstPCMFrame;
                switch (pFlac->currentFLACFrame.header.channelAssignment)
                {
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_LEFT_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_left_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_RIGHT_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_right_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_MID_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_mid_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_INDEPENDENT:
                    default:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_independent_stereo(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                }
            } else {
                ma_uint64 i;
                for (i = 0; i < frameCountThisIteration; ++i) {
                    unsigned int j;
                    for (j = 0; j < channelCount; ++j) {
                        ma_int32 sampleS32 = (ma_int32)((ma_uint32)(pFlac->currentFLACFrame.subframes[j].pSamplesS32[iFirstPCMFrame + i]) << (unusedBitsPerSample + pFlac->currentFLACFrame.subframes[j].wastedBitsPerSample));
                        pBufferOut[(i*channelCount)+j] = (float)(sampleS32 / 2147483648.0);
                    }
                }
            }
            framesRead                += frameCountThisIteration;
            pBufferOut                += frameCountThisIteration * channelCount;
            framesToRead              -= frameCountThisIteration;
            pFlac->currentPCMFrame    += frameCountThisIteration;
            pFlac->currentFLACFrame.pcmFramesRemaining -= (unsigned int)frameCountThisIteration;
        }
    }
    return framesRead;
}